

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indextest.cpp
# Opt level: O0

int testEscapedChars(void)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  VRStringArray s;
  bool in_stack_00000107;
  string *in_stack_00000108;
  string *in_stack_00000110;
  VRDataIndex *in_stack_00000118;
  string inString;
  VRDataIndex *n;
  int loopctr;
  int out;
  VRDatumConverter<MinVR::VRDatum> *in_stack_fffffffffffffea8;
  VRDataIndex *pVVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  allocator<char> *__a;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  allocator<char> local_e9;
  string local_e8 [32];
  VRDatum_conflict *local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string local_a8 [32];
  string local_88 [31];
  undefined1 in_stack_ffffffffffffff97;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  VRDataIndex *in_stack_ffffffffffffffa8;
  allocator<char> local_31;
  string local_30 [32];
  VRDataIndex *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  for (local_8 = 0; local_8 < 1; local_8 = local_8 + 1) {
    local_10 = setupIndex();
    __a = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,__a);
    std::allocator<char>::~allocator(&local_31);
    std::__cxx11::string::string(local_88,local_30);
    std::__cxx11::string::string(local_a8,(string *)MinVR::VRDataIndex::rootNameSpace_abi_cxx11_);
    MinVR::VRDataIndex::addSerializedValue
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (bool)in_stack_ffffffffffffff97);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,__a);
    this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xfffffffffffffeef;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,__a);
    local_c8 = (VRDatum_conflict *)
               MinVR::VRDataIndex::getValue
                         (in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000107);
    MinVR::VRDatumConverter::operator_cast_to_vector(in_stack_fffffffffffffea8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeef);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_c0);
    local_4 = (uint)(sVar2 != 4) + local_4;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_c0,0);
    iVar1 = std::__cxx11::string::compare((char *)pvVar3);
    local_4 = iVar1 + local_4;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_c0,1);
    iVar1 = std::__cxx11::string::compare((char *)pvVar3);
    local_4 = iVar1 + local_4;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_c0,2);
    iVar1 = std::__cxx11::string::compare((char *)pvVar3);
    local_4 = iVar1 + local_4;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_c0,3);
    iVar1 = std::__cxx11::string::compare((char *)pvVar3);
    local_4 = iVar1 + local_4;
    if (local_10 != (VRDataIndex *)0x0) {
      pVVar4 = local_10;
      MinVR::VRDataIndex::~VRDataIndex(local_10);
      operator_delete(pVVar4,0x98);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
    std::__cxx11::string::~string(local_30);
  }
  return local_4;
}

Assistant:

int testEscapedChars() {

  int out = 0;

  LOOP {

    MinVR::VRDataIndex *n = setupIndex();

    // Escaping the comma separator between Gamma and Delta.
    std::string inString = "<mimi type=\"stringarray\" separator=\",\">Alpha,Beta,Gamma\\,Delta,Epsilon</mimi>";
    n->addSerializedValue(inString, MinVR::VRDataIndex::rootNameSpace);

    MinVR::VRStringArray s = n->getValue("/mimi");

    out += (s.size() == 4) ? 0 : 1;

    out += s[0].compare("Alpha");
    out += s[1].compare("Beta");
    out += s[2].compare("Gamma,Delta");
    out += s[3].compare("Epsilon");

    //    std::cout << inString << std::endl;
    //    std::cout << s[0] << "/"  << s[1] << "/"  << s[2] << "/"  << s[3] << "/" << std::endl;
    delete n;
  }